

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_clamp(nk_text_edit *state)

{
  int iVar1;
  
  iVar1 = (state->string).len;
  if (state->select_start != state->select_end) {
    if (iVar1 < state->select_start) {
      state->select_start = iVar1;
    }
    if (iVar1 < state->select_end) {
      state->select_end = iVar1;
    }
    if (state->select_start == state->select_end) {
      state->cursor = state->select_start;
    }
  }
  if (iVar1 < state->cursor) {
    state->cursor = iVar1;
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_clamp(struct nk_text_edit *state)
{
/* make the selection/cursor state valid if client altered the string */
int n = state->string.len;
if (NK_TEXT_HAS_SELECTION(state)) {
if (state->select_start > n) state->select_start = n;
if (state->select_end   > n) state->select_end = n;
/* if clamping forced them to be equal, move the cursor to match */
if (state->select_start == state->select_end)
state->cursor = state->select_start;
}
if (state->cursor > n) state->cursor = n;
}